

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

shared_ptr<chrono::ChBody> __thiscall
chrono::utils::CreateCylindricalContainerFromBoxes
          (utils *this,ChSystem *system,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChVector<double> *hdim,double hthick,int numBoxes,ChVector<double> *pos,
          ChQuaternion<double> *rot,bool collide,bool overlap,bool closed,bool isBoxBase,
          bool partialVisualization)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ChBody *pCVar7;
  element_type *peVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  shared_ptr<chrono::ChMaterialSurface> *psVar17;
  int iVar18;
  int iVar19;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined8 in_XMM0_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  shared_ptr<chrono::ChBody> sVar27;
  ChVector<double> p_pos;
  ChVector<double> p_boxSize;
  ChQuaternion<double> p_quat;
  ChVector<double> local_198;
  double local_180;
  double local_178;
  ChQuaternion<double> local_170;
  shared_ptr<chrono::ChMaterialSurface> *local_150;
  undefined8 local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  shared_ptr<chrono::ChMaterialSurface> local_138;
  shared_ptr<chrono::ChMaterialSurface> local_128;
  shared_ptr<chrono::ChMaterialSurface> local_118;
  shared_ptr<chrono::ChMaterialSurface> local_108;
  shared_ptr<chrono::ChMaterialSurface> local_f8;
  ChVector<double> local_e8;
  utils *local_c8;
  ChSystem *local_c0;
  shared_ptr<chrono::ChVisualMaterial> local_b8;
  shared_ptr<chrono::ChVisualMaterial> local_a8;
  shared_ptr<chrono::ChVisualMaterial> local_98;
  shared_ptr<chrono::ChVisualMaterial> local_88;
  shared_ptr<chrono::ChVisualMaterial> local_78;
  ChVector<double> local_68;
  ChQuaternion<double> local_50;
  
  local_150 = mat;
  iVar18 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->_vptr_ChMaterialSurface[3])();
  iVar19 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                     (system);
  if (iVar18 != iVar19) {
    __assert_fail("mat->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,700,
                  "std::shared_ptr<ChBody> chrono::utils::CreateCylindricalContainerFromBoxes(ChSystem *, int, std::shared_ptr<ChMaterialSurface>, const ChVector<> &, double, int, const ChVector<> &, const ChQuaternion<> &, bool, bool, bool, bool, bool)"
                 );
  }
  iVar18 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])
                     (system);
  *(ChBody **)this = (ChBody *)CONCAT44(extraout_var,iVar18);
  local_c8 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c8,
             (ChBody *)CONCAT44(extraout_var,iVar18));
  lVar4 = *(long *)this;
  *(int *)(lVar4 + 0x28) = id;
  if ((ChVector<double> *)(lVar4 + 0x80) != pos) {
    *(double *)(lVar4 + 0x80) = pos->m_data[0];
    *(double *)(lVar4 + 0x88) = pos->m_data[1];
    *(double *)(lVar4 + 0x90) = pos->m_data[2];
  }
  ChFrame<double>::SetRot((ChFrame<double> *)(lVar4 + 0x78),rot);
  ChBody::SetCollide(*(ChBody **)this,collide);
  ChBody::SetBodyFixed(*(ChBody **)this,true);
  local_178 = hdim->m_data[0] + hdim->m_data[0];
  local_180 = (double)numBoxes;
  dVar23 = tan(3.141592653589793 / local_180);
  local_68.m_data[0] = (dVar23 * local_178 + hthick) * 0.5;
  local_68.m_data[2] = (double)((ulong)overlap * (long)(hthick + hthick)) + hdim->m_data[2];
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  local_e8.m_data[2] = 0.0;
  local_50.m_data[0] = QUNIT;
  local_50.m_data[1] = DAT_00b90978;
  local_50.m_data[2] = DAT_00b90980;
  local_50.m_data[3] = DAT_00b90988;
  plVar5 = *(long **)(*(long *)this + 0x198);
  p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_c0 = system;
  local_68.m_data[1] = hthick;
  (**(code **)(*plVar5 + 0x18))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (0 < numBoxes) {
    local_180 = 6.283185307179586 / local_180;
    iVar18 = 0;
    do {
      dVar23 = (double)iVar18 * local_180;
      local_178 = sin(dVar23);
      local_178 = local_178 * (hthick + hdim->m_data[0]);
      dVar24 = cos(dVar23);
      local_e8.m_data[0] = local_178 + pos->m_data[0];
      local_e8.m_data[1] = dVar24 * (hthick + hdim->m_data[0]) + pos->m_data[1];
      local_e8.m_data[2] = hdim->m_data[2] + pos->m_data[2];
      local_198.m_data[0] = 0.0;
      local_198.m_data[1] = 0.0;
      local_198.m_data[2] = dVar23;
      Angle_to_Quat(&local_170,RXYZ,&local_198);
      local_50.m_data[0] = local_170.m_data[0];
      local_50.m_data[1] = local_170.m_data[1];
      local_50.m_data[2] = local_170.m_data[2];
      local_50.m_data[3] = local_170.m_data[3];
      pCVar7 = *(ChBody **)this;
      local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_150->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (local_150->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChVisualMaterial::Default();
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar23;
      uVar9 = vcmppd_avx512vl(auVar21,ZEXT816(0x4012d97c7f3321d2),5);
      uVar10 = vcmppd_avx512vl(ZEXT816(0x400921fb54442d18),auVar21,5);
      AddBoxGeometry(pCVar7,&local_f8,&local_68,&local_e8,&local_50,
                     (bool)(((byte)uVar10 & 3 | (byte)uVar9 & 3) & 1 | !partialVisualization),
                     &local_78);
      if (local_78.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar18 = iVar18 + 1;
    } while (numBoxes != iVar18);
  }
  psVar17 = local_150;
  pCVar7 = *(ChBody **)this;
  peVar8 = (local_150->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (isBoxBase) {
    local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (local_150->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    auVar13._8_8_ = in_XMM0_Qb;
    auVar13._0_8_ = hthick;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = hdim->m_data[0];
    auVar21 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar13,auVar1);
    local_170.m_data[0] = auVar21._0_8_;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar21 = vxorpd_avx512vl(auVar13,auVar11);
    local_198.m_data[0] = 0.0;
    local_198.m_data[1] = 0.0;
    local_198.m_data[2] = (double)vmovlpd_avx(auVar21);
    local_170.m_data[1] = local_170.m_data[0];
    local_170.m_data[2] = hthick;
    local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar8;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar7,&local_108,(ChVector<double> *)&local_170,&local_198,
                   (ChQuaternion<double> *)&QUNIT,true,&local_88);
    _Var20._M_pi = local_108.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_88.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var20._M_pi = local_108.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
  }
  else {
    local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (local_150->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    auVar14._8_8_ = in_XMM0_Qb;
    auVar14._0_8_ = hthick;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = hdim->m_data[0];
    auVar21 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar14,auVar22);
    auVar12._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = 0x8000000000000000;
    auVar22 = vxorpd_avx512vl(auVar14,auVar12);
    local_198.m_data[0] = 0.0;
    local_198.m_data[1] = 0.0;
    local_198.m_data[2] = (double)vmovlpd_avx(auVar22);
    local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar8;
    Q_from_AngAxis(&local_170,1.5707963267948966,(ChVector<double> *)&VECT_X);
    ChVisualMaterial::Default();
    AddCylinderGeometry(pCVar7,&local_118,auVar21._0_8_,hthick,&local_198,&local_170,true,&local_a8)
    ;
    _Var20._M_pi = local_118.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_a8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var20._M_pi = local_118.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
  }
  if (_Var20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var20._M_pi);
  }
  if (closed) {
    pCVar7 = *(ChBody **)this;
    peVar8 = (psVar17->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (isBoxBase) {
      local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (psVar17->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      auVar25._8_8_ = 0;
      auVar25._0_8_ = hdim->m_data[0];
      auVar15._8_8_ = in_XMM0_Qb;
      auVar15._0_8_ = hthick;
      auVar21 = vfmadd231sd_fma(auVar25,auVar15,ZEXT816(0x4000000000000000));
      local_170.m_data[0] = auVar21._0_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = hdim->m_data[2];
      auVar21 = vfmadd132sd_fma(ZEXT816(0x4000000000000000),auVar15,auVar2);
      local_198.m_data[0] = 0.0;
      local_198.m_data[1] = 0.0;
      local_198.m_data[2] = auVar21._0_8_;
      local_170.m_data[1] = local_170.m_data[0];
      local_170.m_data[2] = hthick;
      local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar8;
      ChVisualMaterial::Default();
      AddBoxGeometry(pCVar7,&local_128,(ChVector<double> *)&local_170,&local_198,
                     (ChQuaternion<double> *)&QUNIT,true,&local_98);
      _Var20._M_pi = local_128.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_98.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var20._M_pi = local_128.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
    }
    else {
      local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (psVar17->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      auVar26._8_8_ = 0;
      auVar26._0_8_ = hdim->m_data[0];
      auVar16._8_8_ = in_XMM0_Qb;
      auVar16._0_8_ = hthick;
      auVar22 = vfmadd231sd_fma(auVar26,auVar16,ZEXT816(0x4000000000000000));
      auVar3._8_8_ = 0;
      auVar3._0_8_ = hdim->m_data[2];
      auVar21 = vfmadd132sd_fma(ZEXT816(0x4000000000000000),auVar16,auVar3);
      local_198.m_data[0] = 0.0;
      local_198.m_data[1] = 0.0;
      local_198.m_data[2] = auVar21._0_8_;
      local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar8;
      Q_from_AngAxis(&local_170,1.5707963267948966,(ChVector<double> *)&VECT_X);
      ChVisualMaterial::Default();
      AddCylinderGeometry(pCVar7,&local_138,auVar22._0_8_,hthick,&local_198,&local_170,true,
                          &local_b8);
      _Var20._M_pi = local_138.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_b8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var20._M_pi = local_138.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
    }
    if (_Var20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var20._M_pi);
    }
  }
  plVar5 = *(long **)(*(long *)this + 0x198);
  p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar5 + 0x120))(hthick * 0.2);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  plVar5 = *(long **)(*(long *)this + 0x198);
  p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar5 + 0x20))();
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  local_148 = *(undefined8 *)this;
  local_140 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_140->_M_use_count = local_140->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_140->_M_use_count = local_140->_M_use_count + 1;
    }
  }
  (*(local_c0->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
            (local_c0,&local_148);
  _Var20._M_pi = extraout_RDX;
  if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
    _Var20._M_pi = extraout_RDX_00;
  }
  sVar27.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var20._M_pi;
  sVar27.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChBody>)
         sVar27.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChBody> CreateCylindricalContainerFromBoxes(ChSystem* system,
                                                            int id,
                                                            std::shared_ptr<ChMaterialSurface> mat,
                                                            const ChVector<>& hdim,
                                                            double hthick,
                                                            int numBoxes,
                                                            const ChVector<>& pos,
                                                            const ChQuaternion<>& rot,
                                                            bool collide,
                                                            bool overlap,
                                                            bool closed,
                                                            bool isBoxBase,
                                                            bool partialVisualization) {
    // Verify consistency of input arguments.
    assert(mat->GetContactMethod() == system->GetContactMethod());

    // Create the body and set material
    std::shared_ptr<ChBody> body(system->NewBody());

    // Set body properties and geometry.
    body->SetIdentifier(id);
    // body->SetMass(1);
    body->SetPos(pos);
    body->SetRot(rot);
    body->SetCollide(collide);
    body->SetBodyFixed(true);

    double box_side = hdim.x() * 2.0 * tan(CH_C_PI / numBoxes);  // side length of cyl
    double o_lap = 0;
    if (overlap) {
        o_lap = hthick * 2;
    }
    double ang = 2.0 * CH_C_PI / numBoxes;
    ChVector<> p_boxSize = ChVector<>((box_side + hthick) / 2.0, hthick, hdim.z() + o_lap);  // size of plates
    ChVector<> p_pos;                                                                        // position of each plate
    ChQuaternion<> p_quat = QUNIT;                                                           // rotation of each plate
    body->GetCollisionModel()->ClearModel();

    for (int i = 0; i < numBoxes; i++) {
        p_pos = pos + ChVector<>(sin(ang * i) * (hthick + hdim.x()), cos(ang * i) * (hthick + hdim.x()), hdim.z());

        p_quat = Angle_to_Quat(AngleSet::RXYZ, ChVector<>(0, 0, ang * i));

        // this is here to make half the cylinder invisible.
        bool m_visualization = true;
        if ((ang * i > CH_C_PI && ang * i < 3.0 * CH_C_PI / 2.0) && partialVisualization) {
            m_visualization = false;
        }
        utils::AddBoxGeometry(body.get(), mat, p_boxSize, p_pos, p_quat, m_visualization);
    }

    // Add ground piece
    if (isBoxBase) {
        utils::AddBoxGeometry(body.get(), mat, Vector(hdim.x() + 2 * hthick, hdim.x() + 2 * hthick, hthick),
                              Vector(0, 0, -hthick), QUNIT, true);
    } else {
        utils::AddCylinderGeometry(body.get(), mat, hdim.x() + 2 * hthick, hthick, ChVector<>(0, 0, -hthick),
                                   Q_from_AngAxis(CH_C_PI / 2, VECT_X));
    }

    if (closed) {
        if (isBoxBase) {
            utils::AddBoxGeometry(body.get(), mat, Vector(hdim.x() + 2 * hthick, hdim.x() + 2 * hthick, hthick),
                                  Vector(0, 0, 2 * hdim.z() + hthick), QUNIT, true);
        } else {
            utils::AddCylinderGeometry(body.get(), mat, hdim.x() + 2 * hthick, hthick,
                                       ChVector<>(0, 0, 2 * hdim.z() + hthick), Q_from_AngAxis(CH_C_PI / 2, VECT_X));
        }
    }

    body->GetCollisionModel()->SetEnvelope(0.2 * hthick);
    body->GetCollisionModel()->BuildModel();

    system->AddBody(body);
    return body;
}